

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderAdjacencyTests::setLineStripPointsIndiced
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  AdjacencyGridPoint *pAVar5;
  AdjacencyGridPoint *pAVar6;
  AdjacencyGridPoint *pAVar7;
  AdjacencyGridPoint *pAVar8;
  undefined1 auVar9 [16];
  ulong uVar10;
  GLfloat *pGVar11;
  GLuint *pGVar12;
  AdjacencyGridPoint *pointN3;
  AdjacencyGridPoint *pointN2;
  AdjacencyGridPoint *pointN1;
  AdjacencyGridPoint *pointN0;
  uint local_40;
  uint n_2;
  uint n_1;
  uint n;
  float *travellerPtr;
  uint *travellerIndicesPtr;
  float *travellerExpectedGeometryPtr;
  float *travellerExpectedAdjacencyGeometryPtr;
  AdjacencyTestData *test_data_local;
  GeometryShaderAdjacencyTests *this_local;
  
  test_data->m_n_vertices = (test_data->m_grid->m_line_strip).m_n_points;
  test_data->m_geometry_bo_size = (test_data->m_n_vertices - 3) * this->m_n_components_output * 8;
  test_data->m_vertex_data_bo_size = test_data->m_n_vertices * this->m_n_components_input * 4;
  test_data->m_index_data_bo_size = test_data->m_n_vertices << 2;
  auVar9 = ZEXT416(test_data->m_geometry_bo_size >> 2) * ZEXT816(4);
  uVar10 = auVar9._0_8_;
  if (auVar9._8_8_ != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pGVar11 = (GLfloat *)operator_new__(uVar10);
  test_data->m_expected_adjacency_geometry = pGVar11;
  auVar9 = ZEXT416(test_data->m_geometry_bo_size >> 2) * ZEXT816(4);
  uVar10 = auVar9._0_8_;
  if (auVar9._8_8_ != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pGVar11 = (GLfloat *)operator_new__(uVar10);
  test_data->m_expected_geometry = pGVar11;
  auVar9 = ZEXT416(test_data->m_index_data_bo_size >> 2) * ZEXT816(4);
  uVar10 = auVar9._0_8_;
  if (auVar9._8_8_ != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pGVar12 = (GLuint *)operator_new__(uVar10);
  test_data->m_index_data = pGVar12;
  auVar9 = ZEXT416(test_data->m_vertex_data_bo_size >> 2) * ZEXT816(4);
  uVar10 = auVar9._0_8_;
  if (auVar9._8_8_ != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pGVar11 = (GLfloat *)operator_new__(uVar10);
  test_data->m_vertex_data = pGVar11;
  travellerExpectedGeometryPtr = test_data->m_expected_adjacency_geometry;
  travellerIndicesPtr = (uint *)test_data->m_expected_geometry;
  travellerPtr = (float *)test_data->m_index_data;
  _n_1 = test_data->m_vertex_data;
  for (n_2 = 0; n_2 < test_data->m_n_vertices; n_2 = n_2 + 1) {
    *_n_1 = (test_data->m_grid->m_line_strip).m_points[n_2].x;
    _n_1[1] = (test_data->m_grid->m_line_strip).m_points[n_2].y;
    _n_1 = _n_1 + 2;
  }
  for (local_40 = 0; local_40 < test_data->m_n_vertices; local_40 = local_40 + 1) {
    *travellerPtr = (float)((test_data->m_n_vertices - local_40) + -1);
    travellerPtr = travellerPtr + 1;
  }
  for (pointN0._4_4_ = 0; pointN0._4_4_ < test_data->m_n_vertices - 3;
      pointN0._4_4_ = pointN0._4_4_ + 1) {
    pAVar5 = (test_data->m_grid->m_line_strip).m_points;
    uVar1 = test_data->m_index_data[pointN0._4_4_];
    pAVar6 = (test_data->m_grid->m_line_strip).m_points;
    uVar2 = test_data->m_index_data[pointN0._4_4_ + 1];
    pAVar7 = (test_data->m_grid->m_line_strip).m_points;
    uVar3 = test_data->m_index_data[pointN0._4_4_ + 2];
    pAVar8 = (test_data->m_grid->m_line_strip).m_points;
    uVar4 = test_data->m_index_data[pointN0._4_4_ + 3];
    *travellerExpectedGeometryPtr = pAVar5[uVar1].x;
    travellerExpectedGeometryPtr[1] = pAVar5[uVar1].y;
    travellerExpectedGeometryPtr[2] = 0.0;
    travellerExpectedGeometryPtr[3] = 1.0;
    travellerExpectedGeometryPtr[4] = pAVar8[uVar4].x;
    travellerExpectedGeometryPtr[5] = pAVar8[uVar4].y;
    travellerExpectedGeometryPtr[6] = 0.0;
    travellerExpectedGeometryPtr[7] = 1.0;
    travellerExpectedGeometryPtr = travellerExpectedGeometryPtr + 8;
    *travellerIndicesPtr = (uint)pAVar6[uVar2].x;
    travellerIndicesPtr[1] = (uint)pAVar6[uVar2].y;
    travellerIndicesPtr[2] = 0;
    travellerIndicesPtr[3] = 0x3f800000;
    travellerIndicesPtr[4] = (uint)pAVar7[uVar3].x;
    travellerIndicesPtr[5] = (uint)pAVar7[uVar3].y;
    travellerIndicesPtr[6] = 0;
    travellerIndicesPtr[7] = 0x3f800000;
    travellerIndicesPtr = travellerIndicesPtr + 8;
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::setLineStripPointsIndiced(AdjacencyTestData& test_data)
{

	float*		  travellerExpectedAdjacencyGeometryPtr = 0;
	float*		  travellerExpectedGeometryPtr			= 0;
	unsigned int* travellerIndicesPtr					= 0;
	float*		  travellerPtr							= 0;

	/* Set buffer sizes */
	test_data.m_n_vertices		 = test_data.m_grid->m_line_strip.m_n_points;
	test_data.m_geometry_bo_size = static_cast<glw::GLuint>((test_data.m_n_vertices - 3) * m_n_components_output *
															2 /* start/end */ * sizeof(float));
	test_data.m_vertex_data_bo_size =
		static_cast<glw::GLuint>(test_data.m_n_vertices * m_n_components_input * sizeof(float));
	test_data.m_index_data_bo_size = static_cast<glw::GLuint>(test_data.m_n_vertices * sizeof(unsigned int));

	/* Allocate memory for input and expected data */
	test_data.m_expected_adjacency_geometry = new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_expected_geometry			= new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_index_data					= new unsigned int[test_data.m_index_data_bo_size / sizeof(unsigned int)];
	test_data.m_vertex_data					= new float[test_data.m_vertex_data_bo_size / sizeof(float)];

	travellerExpectedAdjacencyGeometryPtr = test_data.m_expected_adjacency_geometry;
	travellerExpectedGeometryPtr		  = test_data.m_expected_geometry;
	travellerIndicesPtr					  = test_data.m_index_data;
	travellerPtr						  = test_data.m_vertex_data;

	/* Set input and expected value s*/
	for (unsigned int n = 0; n < test_data.m_n_vertices; ++n)
	{
		*travellerPtr = test_data.m_grid->m_line_strip.m_points[n].x;
		++travellerPtr;
		*travellerPtr = test_data.m_grid->m_line_strip.m_points[n].y;
		++travellerPtr;
	}

	for (unsigned int n = 0; n < test_data.m_n_vertices; ++n)
	{
		*travellerIndicesPtr = (test_data.m_n_vertices - n - 1);
		++travellerIndicesPtr;
	}

	for (unsigned int n = 0; n < test_data.m_n_vertices - 3; ++n)
	{
		AdjacencyGridPoint* pointN0 = test_data.m_grid->m_line_strip.m_points + test_data.m_index_data[n];
		AdjacencyGridPoint* pointN1 = test_data.m_grid->m_line_strip.m_points + test_data.m_index_data[n + 1];
		AdjacencyGridPoint* pointN2 = test_data.m_grid->m_line_strip.m_points + test_data.m_index_data[n + 2];
		AdjacencyGridPoint* pointN3 = test_data.m_grid->m_line_strip.m_points + test_data.m_index_data[n + 3];

		*travellerExpectedAdjacencyGeometryPtr = pointN0->x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = pointN0->y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = pointN3->x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = pointN3->y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;

		*travellerExpectedGeometryPtr = pointN1->x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = pointN1->y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = pointN2->x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = pointN2->y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
	} /* for (all vertices apart from the three last ones) */
}